

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void llvm::
     SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
     ::destroy_range(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                     *S,InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                        *E)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *__ptr;
  long *plVar2;
  
  if (E != S) {
    do {
      __ptr = (undefined1 *)
              E[-1].
              super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
              .super_SmallVectorBase.BeginX;
      if (&E[-1].
           super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
           .unparsed.
           super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed>
           .
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
           .FirstEl != (U *)__ptr) {
        free(__ptr);
      }
      plVar2 = (long *)E[-1].
                       super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                       .values.base.
                       super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
                       .value.val_._M_dataplus._M_p;
      paVar1 = &E[-1].
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                .values.base.
                super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
                .value.val_.field_2;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar1->_M_allocated_capacity + 1);
      }
      plVar2 = *(long **)&E[-1].
                          super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                          .values.base.
                          super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
                          .value.val_._M_dataplus;
      paVar1 = &E[-1].
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                .values.base.
                super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
                .value.val_.field_2;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar1->_M_allocated_capacity + 1);
      }
      E = E + -1;
    } while (E != S);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }